

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles3::Functional::DepthStencilCaseUtil::getStencilTestValues
               (int stencilBits,int numValues,int *values)

{
  int local_2c;
  int local_28;
  int ndx_1;
  int ndx;
  int maxVal;
  int numHighest;
  int numLowest;
  int *values_local;
  int numValues_local;
  int stencilBits_local;
  
  for (local_28 = 0; local_28 < numValues / 2; local_28 = local_28 + 1) {
    values[local_28] = local_28;
  }
  for (local_2c = 0; local_2c < numValues - numValues / 2; local_2c = local_2c + 1) {
    values[(numValues - local_2c) + -1] = ((1 << ((byte)stencilBits & 0x1f)) + -1) - local_2c;
  }
  return;
}

Assistant:

void getStencilTestValues (int stencilBits, int numValues, int* values)
{
	int numLowest		= numValues/2;
	int	numHighest		= numValues-numLowest;
	int	maxVal			= (1<<stencilBits)-1;

	for (int ndx = 0; ndx < numLowest; ndx++)
		values[ndx] = ndx;

	for (int ndx = 0; ndx < numHighest; ndx++)
		values[numValues-ndx-1] = maxVal-ndx;
}